

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O3

char * QTest::toString(char *str)

{
  size_t sVar1;
  char *pcVar2;
  
  if (str != (char *)0x0) {
    sVar1 = strlen(str);
    pcVar2 = (char *)operator_new__(sVar1 + 1);
    pcVar2 = (char *)qstrcpy(pcVar2,str);
    return pcVar2;
  }
  pcVar2 = (char *)operator_new__(1);
  *pcVar2 = '\0';
  return pcVar2;
}

Assistant:

char *QTest::toString(const char *str)
{
    if (!str) {
        char *msg = new char[1];
        *msg = '\0';
        return msg;
    }
    char *msg = new char[strlen(str) + 1];
    return qstrcpy(msg, str);
}